

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SmallPtrSet.h
# Opt level: O2

void ** __thiscall llvm::SmallPtrSetImplBase::find_imp(SmallPtrSetImplBase *this,void *Ptr)

{
  void **APtr;
  void **ppvVar1;
  long lVar2;
  
  ppvVar1 = this->SmallArray;
  if (this->CurArray == ppvVar1) {
    for (lVar2 = (ulong)this->NumNonEmpty * 8; lVar2 != 0; lVar2 = lVar2 + -8) {
      if (*ppvVar1 == Ptr) {
        return ppvVar1;
      }
      ppvVar1 = ppvVar1 + 1;
    }
    ppvVar1 = this->CurArray + this->NumNonEmpty;
  }
  else {
    ppvVar1 = FindBucketFor(this,Ptr);
    if (*ppvVar1 != Ptr) {
      ppvVar1 = this->CurArray + (&this->CurArraySize)[this->CurArray == this->SmallArray];
    }
  }
  return ppvVar1;
}

Assistant:

const void *const * find_imp(const void * Ptr) const {
    if (isSmall()) {
      // Linear search for the item.
      for (const void *const *APtr = SmallArray,
                      *const *E = SmallArray + NumNonEmpty; APtr != E; ++APtr)
        if (*APtr == Ptr)
          return APtr;
      return EndPointer();
    }

    // Big set case.
    auto *Bucket = FindBucketFor(Ptr);
    if (*Bucket == Ptr)
      return Bucket;
    return EndPointer();
  }